

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O0

void __thiscall
myvk::DescriptorSet::UpdateStorageBuffer
          (DescriptorSet *this,Ptr<BufferBase> *buffer,uint32_t binding,uint32_t array_element,
          VkDeviceSize offset,VkDeviceSize range)

{
  PFN_vkUpdateDescriptorSets p_Var1;
  element_type *this_00;
  element_type *this_01;
  VkDevice pVVar2;
  uint32_t in_ECX;
  uint32_t in_EDX;
  long *in_RDI;
  VkDeviceSize in_R8;
  VkDeviceSize in_R9;
  VkWriteDescriptorSet write;
  VkDescriptorBufferInfo info;
  VkWriteDescriptorSet local_80;
  VkDescriptorBufferInfo local_40;
  undefined8 local_28;
  undefined8 local_20;
  uint32_t local_18;
  uint32_t local_14;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  memset(&local_40,0,0x18);
  this_00 = std::__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e5b5a);
  local_40.buffer = BufferBase::GetHandle(this_00);
  local_40.range = local_28;
  local_40.offset = local_20;
  memset(&local_80,0,0x40);
  p_Var1 = vkUpdateDescriptorSets;
  local_80.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  local_80.dstSet = (VkDescriptorSet)in_RDI[7];
  local_80.dstBinding = local_14;
  local_80.dstArrayElement = local_18;
  local_80.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_80.descriptorCount = 1;
  local_80.pBufferInfo = &local_40;
  (**(code **)(*in_RDI + 0x10))();
  this_01 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e5bef);
  pVVar2 = Device::GetHandle(this_01);
  (*p_Var1)(pVVar2,1,&local_80,0,(VkCopyDescriptorSet *)0x0);
  return;
}

Assistant:

void DescriptorSet::UpdateStorageBuffer(const Ptr<BufferBase> &buffer, uint32_t binding, uint32_t array_element,
                                        VkDeviceSize offset, VkDeviceSize range) const {
	VkDescriptorBufferInfo info = {};
	info.buffer = buffer->GetHandle();
	info.range = range;
	info.offset = offset;

	VkWriteDescriptorSet write = {};
	write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
	write.dstSet = m_descriptor_set;
	write.dstBinding = binding;
	write.dstArrayElement = array_element;
	write.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
	write.descriptorCount = 1;
	write.pBufferInfo = &info;

	vkUpdateDescriptorSets(GetDevicePtr()->GetHandle(), 1, &write, 0, nullptr);
}